

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

void av1_cnn_convolve(float **input,int in_width,int in_height,int in_stride,
                     CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,
                     int step)

{
  int iVar1;
  PADDING_TYPE PVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int l;
  int iVar24;
  int iVar25;
  uint uVar26;
  float *pfVar27;
  uint uVar28;
  uint uVar29;
  int k;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int k_2;
  int iVar39;
  ulong uVar40;
  float fVar41;
  float fVar42;
  ulong local_168;
  int local_158;
  ulong local_150;
  long local_148;
  ulong local_138;
  long local_128;
  long local_120;
  long local_110;
  long local_e0;
  long local_d8;
  long local_c8;
  long local_98;
  int local_7c;
  long local_58;
  
  uVar3 = layer_config->in_channels;
  uVar20 = (ulong)uVar3;
  uVar4 = layer_config->filter_width;
  uVar13 = (ulong)uVar4;
  uVar30 = layer_config->out_channels;
  uVar14 = (ulong)uVar30;
  iVar23 = uVar30 * uVar3;
  iVar9 = layer_config->filter_height;
  iVar21 = iVar9 >> 1;
  iVar15 = (int)uVar4 >> 1;
  uVar33 = 1;
  if (1 < step) {
    uVar33 = (ulong)(uint)step;
  }
  if ((layer_config->maxpool == 0) ||
     ((iVar22 = layer_config->skip_height, iVar22 < 2 && (layer_config->skip_width < 2)))) {
    if (uVar4 == 1 && iVar9 == 1) {
      if (0 < (int)uVar30) {
        uVar4 = layer_config->skip_width;
        uVar13 = (long)in_width % (long)(int)uVar4 & 0xffffffff;
        if ((int)((long)in_width % (long)(int)uVar4) == 0) {
          uVar13 = (ulong)uVar4;
        }
        iVar9 = (int)(uVar13 >> 0x1f) + (int)uVar13;
        iVar21 = uVar4 * start_idx + (iVar9 >> 0x1f & iVar9 >> 1);
        iVar9 = layer_config->skip_height;
        iVar15 = in_height % iVar9;
        if (in_height % iVar9 == 0) {
          iVar15 = iVar9;
        }
        uVar30 = iVar15 - (iVar15 >> 0x1f) >> 0x1f & iVar15 / 2;
        local_120 = 0;
        uVar13 = 0;
        do {
          local_138 = (long)(int)uVar30;
          iVar15 = start_idx;
          if ((int)uVar30 < in_height) {
            do {
              if (iVar21 < in_width) {
                lVar31 = (long)iVar15;
                pfVar5 = layer_config->bias;
                pfVar6 = output[uVar13];
                lVar34 = (long)iVar21;
                do {
                  fVar41 = pfVar5[uVar13];
                  if (0 < (int)uVar3) {
                    pfVar27 = (float *)((long)layer_config->weights + local_120);
                    uVar12 = 0;
                    do {
                      fVar41 = fVar41 + *pfVar27 *
                                        input[uVar12][lVar34 + local_138 * (long)in_stride];
                      uVar12 = uVar12 + 1;
                      pfVar27 = pfVar27 + uVar14;
                    } while (uVar20 != uVar12);
                  }
                  pfVar6[lVar31] = fVar41;
                  lVar34 = lVar34 + (int)(uVar4 * (int)uVar33);
                  lVar31 = lVar31 + uVar33;
                } while (lVar34 < in_width);
              }
              local_138 = local_138 + (long)iVar9;
              iVar15 = iVar15 + out_stride;
            } while ((long)local_138 < (long)in_height);
          }
          uVar13 = uVar13 + 1;
          local_120 = local_120 + 4;
        } while (uVar13 != uVar14);
      }
    }
    else {
      PVar2 = layer_config->pad;
      if (PVar2 == '\x02') {
        (*av1_cnn_convolve_no_maxpool_padding_valid)
                  (input,in_width,in_height,in_stride,layer_config,output,out_stride,start_idx,
                   iVar23,(int)uVar33);
      }
      else {
        iVar17 = iVar9 + -1;
        uVar26 = (iVar9 - (iVar17 >> 0x1f)) - 1;
        iVar22 = ((uVar26 & 0xfffffffe) - iVar17) + iVar21;
        iVar8 = uVar4 - 1;
        uVar29 = (uVar4 - (iVar8 >> 0x1f)) - 1;
        iVar37 = ((uVar29 & 0xfffffffe) - iVar8) + iVar15;
        if (PVar2 == '\x01') {
          iVar18 = (int)uVar26 >> 1;
          iVar17 = (int)uVar29 >> 1;
          iVar15 = layer_config->skip_width;
          iVar21 = layer_config->skip_height;
          iVar8 = in_height % iVar21;
          if (in_height % iVar21 == 0) {
            iVar8 = iVar21;
          }
          iVar8 = ((iVar9 % 2 + iVar8) - (iVar8 + iVar9 % 2 + -1 >> 0x1f)) + -1 >> 1;
          if (iVar18 <= iVar8) {
            iVar8 = iVar18;
          }
          iVar18 = in_width % iVar15;
          if (in_width % iVar15 == 0) {
            iVar18 = iVar15;
          }
          iVar18 = (((int)uVar4 % 2 + iVar18) - (iVar18 + (int)uVar4 % 2 + -1 >> 0x1f)) + -1 >> 1;
          if (iVar17 <= iVar18) {
            iVar18 = iVar17;
          }
          if (start_idx < (int)uVar30) {
            local_128 = (long)start_idx;
            do {
              if (iVar8 < in_height) {
                iVar17 = 0;
                iVar19 = iVar8 - iVar22;
                do {
                  if (iVar18 < in_width) {
                    lVar34 = (long)iVar17;
                    pfVar5 = layer_config->bias;
                    pfVar6 = output[local_128];
                    iVar16 = iVar18 - iVar37;
                    do {
                      fVar41 = pfVar5[local_128];
                      if (0 < (int)uVar3) {
                        uVar14 = 0;
                        do {
                          if (0 < iVar9) {
                            iVar10 = (int)uVar14 * uVar30 + (int)local_128;
                            iVar7 = iVar19;
                            do {
                              if (0 < (int)uVar4) {
                                iVar38 = in_height + -1;
                                if (iVar7 < in_height) {
                                  iVar38 = iVar7;
                                }
                                if (iVar7 < 0) {
                                  iVar38 = 0;
                                }
                                pfVar27 = layer_config->weights + iVar10;
                                iVar11 = iVar16;
                                do {
                                  iVar25 = in_width + -1;
                                  if (iVar11 < in_width) {
                                    iVar25 = iVar11;
                                  }
                                  if (iVar11 < 0) {
                                    iVar25 = 0;
                                  }
                                  fVar41 = fVar41 + *pfVar27 *
                                                    input[uVar14][iVar25 + iVar38 * in_stride];
                                  iVar11 = iVar11 + 1;
                                  iVar10 = iVar10 + iVar23;
                                  pfVar27 = pfVar27 + iVar23;
                                } while (iVar11 < (int)(iVar16 + uVar4));
                              }
                              iVar7 = iVar7 + 1;
                            } while (iVar7 < iVar9 + iVar19);
                          }
                          uVar14 = uVar14 + 1;
                        } while (uVar14 != uVar20);
                      }
                      pfVar6[lVar34] = fVar41;
                      iVar16 = iVar16 + iVar15;
                      lVar34 = lVar34 + 1;
                    } while (iVar16 < in_width - iVar37);
                  }
                  iVar19 = iVar19 + iVar21;
                  iVar17 = iVar17 + out_stride;
                } while (iVar19 < in_height - iVar22);
              }
              local_128 = local_128 + uVar33;
            } while (local_128 < (int)uVar30);
          }
        }
        else if (PVar2 == '\0') {
          iVar18 = layer_config->skip_width;
          iVar19 = layer_config->skip_height;
          iVar16 = in_height % iVar19;
          if (in_height % iVar19 == 0) {
            iVar16 = iVar19;
          }
          iVar9 = ((iVar9 % 2 + iVar16) - (iVar9 % 2 + iVar16 + -1 >> 0x1f)) + -1 >> 1;
          if (iVar17 / 2 <= iVar9) {
            iVar9 = iVar17 / 2;
          }
          iVar17 = in_width % iVar18;
          if (in_width % iVar18 == 0) {
            iVar17 = iVar18;
          }
          iVar17 = (((int)uVar4 % 2 + iVar17) - ((int)uVar4 % 2 + iVar17 + -1 >> 0x1f)) + -1 >> 1;
          if (iVar8 / 2 <= iVar17) {
            iVar17 = iVar8 / 2;
          }
          if (start_idx < (int)uVar30) {
            local_148 = (long)start_idx;
            do {
              if (iVar9 < in_height) {
                local_7c = 0;
                uVar29 = iVar9 - iVar22;
                iVar8 = iVar9;
                do {
                  uVar14 = 0;
                  if (0 < (int)uVar29) {
                    uVar14 = (ulong)uVar29;
                  }
                  iVar16 = (iVar22 - iVar8) * uVar4;
                  if (iVar16 < 1) {
                    iVar16 = 0;
                  }
                  if (iVar17 < in_width) {
                    local_158 = iVar16 * iVar23 + (int)local_148;
                    iVar16 = iVar21 + 1 + iVar8;
                    if (in_height <= iVar16) {
                      iVar16 = in_height;
                    }
                    iVar7 = iVar8 - iVar22;
                    if (iVar8 - iVar22 < 1) {
                      iVar7 = 0;
                    }
                    lVar34 = (long)local_7c;
                    pfVar5 = layer_config->bias;
                    pfVar6 = output[local_148];
                    iVar38 = iVar37 - iVar17;
                    uVar26 = iVar17 - iVar37;
                    iVar10 = iVar17;
                    do {
                      iVar25 = 0;
                      iVar11 = 0;
                      if (0 < iVar38) {
                        iVar11 = iVar38;
                      }
                      uVar13 = 0;
                      if (0 < (int)uVar26) {
                        uVar13 = (ulong)uVar26;
                      }
                      iVar36 = iVar37 - iVar10;
                      if (iVar37 - iVar10 < 1) {
                        iVar36 = iVar25;
                      }
                      iVar24 = ((iVar15 + 1) - in_width) + iVar10;
                      if (iVar24 < 1) {
                        iVar24 = iVar25;
                      }
                      fVar41 = pfVar5[local_148];
                      if (0 < (int)uVar3) {
                        iVar39 = iVar15 + 1 + iVar10;
                        if (in_width <= iVar39) {
                          iVar39 = in_width;
                        }
                        iVar1 = iVar10 - iVar37;
                        if (iVar10 - iVar37 < 1) {
                          iVar1 = iVar25;
                        }
                        uVar12 = 0;
                        do {
                          if (iVar7 < iVar16) {
                            iVar25 = (int)uVar12 * uVar30 + local_158;
                            lVar31 = (long)in_stride * 4 * uVar14;
                            uVar32 = uVar14;
                            do {
                              if (iVar1 < iVar39) {
                                iVar25 = iVar25 + iVar11 * uVar30 * uVar3;
                                pfVar27 = layer_config->weights + iVar25;
                                uVar40 = uVar13;
                                do {
                                  fVar41 = fVar41 + *pfVar27 *
                                                    *(float *)((long)input[uVar12] +
                                                              uVar40 * 4 + lVar31);
                                  uVar40 = uVar40 + 1;
                                  iVar25 = iVar25 + iVar23;
                                  pfVar27 = pfVar27 + iVar23;
                                } while ((long)uVar40 < (long)iVar39);
                              }
                              else {
                                iVar25 = iVar25 + iVar36 * iVar23;
                              }
                              iVar25 = iVar25 + iVar24 * iVar23;
                              uVar32 = uVar32 + 1;
                              lVar31 = lVar31 + (long)in_stride * 4;
                            } while ((long)uVar32 < (long)iVar16);
                          }
                          uVar12 = uVar12 + 1;
                        } while (uVar12 != uVar20);
                      }
                      pfVar6[lVar34] = fVar41;
                      iVar10 = iVar10 + iVar18;
                      lVar34 = lVar34 + 1;
                      uVar26 = uVar26 + iVar18;
                      iVar38 = iVar38 - iVar18;
                    } while (iVar10 < in_width);
                  }
                  iVar8 = iVar8 + iVar19;
                  uVar29 = uVar29 + iVar19;
                  local_7c = local_7c + out_stride;
                } while (iVar8 < in_height);
              }
              local_148 = local_148 + uVar33;
            } while (local_148 < (int)uVar30);
          }
        }
      }
    }
  }
  else {
    PVar2 = layer_config->pad;
    if (PVar2 == '\x02') {
      if (0 < (int)uVar30) {
        uVar33 = 0;
        do {
          if (-1 < in_height - iVar9) {
            iVar21 = 0;
            local_e0 = 0;
            iVar15 = 0;
            do {
              if (-1 < (int)(in_width - uVar4)) {
                iVar8 = iVar15 + iVar22;
                if (in_height <= iVar15 + iVar22) {
                  iVar8 = in_height;
                }
                iVar37 = layer_config->skip_width;
                local_110 = 0;
                iVar18 = 0;
                iVar17 = iVar21;
                do {
                  if (iVar15 < iVar8) {
                    iVar19 = iVar15;
                    iVar16 = iVar17;
                    iVar7 = iVar37 + iVar18;
                    if (in_width <= iVar37 + iVar18) {
                      iVar7 = in_width;
                    }
                    do {
                      if (iVar18 < iVar7) {
                        pfVar5 = layer_config->bias;
                        pfVar6 = output[uVar33];
                        iVar10 = iVar16;
                        iVar38 = iVar18;
                        do {
                          fVar41 = pfVar5[uVar33];
                          if (0 < (int)uVar3) {
                            uVar12 = 0;
                            do {
                              if (0 < iVar9) {
                                iVar25 = (int)uVar12 * uVar30 + (int)uVar33;
                                iVar36 = 0;
                                iVar11 = iVar10;
                                do {
                                  if (0 < (int)uVar4) {
                                    pfVar27 = layer_config->weights + iVar25;
                                    uVar32 = uVar13;
                                    iVar24 = iVar11;
                                    do {
                                      fVar41 = fVar41 + *pfVar27 * input[uVar12][iVar24];
                                      pfVar27 = pfVar27 + iVar23;
                                      iVar24 = iVar24 + 1;
                                      uVar32 = uVar32 - 1;
                                    } while (uVar32 != 0);
                                    iVar25 = iVar25 + iVar23 * uVar4;
                                  }
                                  iVar36 = iVar36 + 1;
                                  iVar11 = iVar11 + in_stride;
                                } while (iVar36 != iVar9);
                              }
                              uVar12 = uVar12 + 1;
                            } while (uVar12 != uVar20);
                          }
                          fVar42 = fVar41;
                          if ((iVar18 != iVar38 || iVar15 != iVar19) &&
                             (fVar42 = pfVar6[local_110 + local_e0 * out_stride], fVar42 <= fVar41))
                          {
                            fVar42 = fVar41;
                          }
                          pfVar6[local_110 + local_e0 * out_stride] = fVar42;
                          iVar38 = iVar38 + 1;
                          iVar10 = iVar10 + 1;
                        } while (iVar38 < iVar7);
                      }
                      iVar19 = iVar19 + 1;
                      iVar16 = iVar16 + in_stride;
                    } while (iVar19 < iVar8);
                  }
                  iVar18 = iVar18 + iVar37;
                  local_110 = local_110 + 1;
                  iVar17 = iVar17 + iVar37;
                } while (iVar18 <= (int)(in_width - uVar4));
              }
              iVar15 = iVar15 + iVar22;
              local_e0 = local_e0 + 1;
              iVar21 = iVar21 + iVar22 * in_stride;
            } while (iVar15 <= in_height - iVar9);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar14);
      }
    }
    else if (PVar2 == '\x01') {
      if (0 < (int)uVar30) {
        local_150 = 0;
        do {
          if (0 < in_height) {
            local_98 = 0;
            iVar8 = 0;
            do {
              if (0 < in_width) {
                iVar17 = iVar8 + iVar22;
                if (in_height <= iVar8 + iVar22) {
                  iVar17 = in_height;
                }
                iVar18 = layer_config->skip_width;
                local_c8 = 0;
                iVar19 = 0;
                iVar37 = -iVar15;
                do {
                  if (iVar8 < iVar17) {
                    iVar16 = iVar8;
                    iVar7 = iVar18 + iVar19;
                    if (in_width <= iVar18 + iVar19) {
                      iVar7 = in_width;
                    }
                    do {
                      if (iVar19 < iVar7) {
                        pfVar5 = layer_config->bias;
                        pfVar6 = output[local_150];
                        iVar38 = iVar19;
                        iVar10 = iVar37;
                        do {
                          fVar41 = pfVar5[local_150];
                          if (0 < (int)uVar3) {
                            local_138 = 0;
                            do {
                              if (0 < iVar9) {
                                iVar11 = (int)local_138 * uVar30 + (int)local_150;
                                iVar25 = 0;
                                do {
                                  if (0 < (int)uVar4) {
                                    iVar24 = (iVar16 - iVar21) + iVar25;
                                    iVar36 = in_height + -1;
                                    if (iVar24 < in_height) {
                                      iVar36 = iVar24;
                                    }
                                    if (iVar24 < 0) {
                                      iVar36 = 0;
                                    }
                                    pfVar27 = layer_config->weights + iVar11;
                                    uVar33 = uVar13;
                                    iVar24 = iVar10;
                                    do {
                                      iVar39 = in_width + -1;
                                      if (iVar24 < in_width) {
                                        iVar39 = iVar24;
                                      }
                                      if (iVar24 < 0) {
                                        iVar39 = 0;
                                      }
                                      fVar41 = fVar41 + *pfVar27 *
                                                        input[local_138]
                                                        [iVar39 + iVar36 * in_stride];
                                      iVar11 = iVar11 + iVar23;
                                      pfVar27 = pfVar27 + iVar23;
                                      iVar24 = iVar24 + 1;
                                      uVar29 = (int)uVar33 - 1;
                                      uVar33 = (ulong)uVar29;
                                    } while (uVar29 != 0);
                                  }
                                  iVar25 = iVar25 + 1;
                                } while (iVar25 != iVar9);
                              }
                              local_138 = local_138 + 1;
                            } while (local_138 != uVar20);
                          }
                          fVar42 = fVar41;
                          if ((iVar19 != iVar38 || iVar8 != iVar16) &&
                             (fVar42 = pfVar6[local_c8 + local_98 * out_stride], fVar42 <= fVar41))
                          {
                            fVar42 = fVar41;
                          }
                          pfVar6[local_c8 + local_98 * out_stride] = fVar42;
                          iVar38 = iVar38 + 1;
                          iVar10 = iVar10 + 1;
                        } while (iVar38 < iVar7);
                      }
                      iVar16 = iVar16 + 1;
                    } while (iVar16 < iVar17);
                  }
                  iVar19 = iVar19 + iVar18;
                  local_c8 = local_c8 + 1;
                  iVar37 = iVar37 + iVar18;
                } while (iVar19 < in_width);
              }
              iVar8 = iVar8 + iVar22;
              local_98 = local_98 + 1;
            } while (iVar8 < in_height);
          }
          local_150 = local_150 + 1;
        } while (local_150 != uVar14);
      }
    }
    else if ((PVar2 == '\0') && (0 < (int)uVar30)) {
      local_168 = 0;
      do {
        if (0 < in_height) {
          local_58 = 0;
          iVar17 = 0;
          iVar8 = -(iVar21 * in_stride + iVar15);
          do {
            if (0 < in_width) {
              iVar37 = iVar17 + iVar22;
              if (in_height <= iVar17 + iVar22) {
                iVar37 = in_height;
              }
              iVar19 = layer_config->skip_width;
              local_d8 = 0;
              iVar16 = 0;
              uVar29 = -iVar15;
              iVar18 = iVar8;
              do {
                if (iVar17 < iVar37) {
                  iVar7 = iVar17;
                  iVar10 = iVar18;
                  iVar38 = iVar19 + iVar16;
                  if (in_width <= iVar19 + iVar16) {
                    iVar38 = in_width;
                  }
                  do {
                    if (iVar16 < iVar38) {
                      pfVar5 = layer_config->bias;
                      pfVar6 = output[local_168];
                      iVar25 = iVar16;
                      uVar26 = uVar29;
                      iVar11 = iVar10;
                      do {
                        fVar41 = pfVar5[local_168];
                        if (0 < (int)uVar3) {
                          uVar33 = 0;
                          do {
                            if (0 < iVar9) {
                              iVar39 = (int)local_168 + (int)uVar33 * uVar30;
                              iVar24 = 0;
                              iVar36 = iVar11;
                              do {
                                if (0 < (int)uVar4) {
                                  iVar1 = (iVar7 - iVar21) + iVar24;
                                  lVar34 = (long)iVar39 << 2;
                                  uVar12 = uVar13;
                                  uVar28 = uVar26;
                                  iVar35 = iVar36;
                                  do {
                                    if (((-1 < iVar1) && (iVar1 < in_height)) &&
                                       (uVar28 < (uint)in_width)) {
                                      fVar41 = fVar41 + *(float *)((long)layer_config->weights +
                                                                  lVar34) * input[uVar33][iVar35];
                                    }
                                    lVar34 = lVar34 + (long)iVar23 * 4;
                                    iVar35 = iVar35 + 1;
                                    uVar28 = uVar28 + 1;
                                    uVar12 = uVar12 - 1;
                                  } while (uVar12 != 0);
                                  iVar39 = iVar39 + iVar23 * uVar4;
                                }
                                iVar24 = iVar24 + 1;
                                iVar36 = iVar36 + in_stride;
                              } while (iVar24 != iVar9);
                            }
                            uVar33 = uVar33 + 1;
                          } while (uVar33 != uVar20);
                        }
                        fVar42 = fVar41;
                        if ((iVar16 != iVar25 || iVar17 != iVar7) &&
                           (fVar42 = pfVar6[local_d8 + local_58 * out_stride], fVar42 <= fVar41)) {
                          fVar42 = fVar41;
                        }
                        pfVar6[local_d8 + local_58 * out_stride] = fVar42;
                        iVar25 = iVar25 + 1;
                        iVar11 = iVar11 + 1;
                        uVar26 = uVar26 + 1;
                      } while (iVar25 < iVar38);
                    }
                    iVar7 = iVar7 + 1;
                    iVar10 = iVar10 + in_stride;
                  } while (iVar7 < iVar37);
                }
                iVar16 = iVar16 + iVar19;
                local_d8 = local_d8 + 1;
                iVar18 = iVar18 + iVar19;
                uVar29 = uVar29 + iVar19;
              } while (iVar16 < in_width);
            }
            iVar17 = iVar17 + iVar22;
            local_58 = local_58 + 1;
            iVar8 = iVar8 + iVar22 * in_stride;
          } while (iVar17 < in_height);
        }
        local_168 = local_168 + 1;
      } while (local_168 != uVar14);
    }
  }
  return;
}

Assistant:

static void av1_cnn_convolve(const float **input, int in_width, int in_height,
                             int in_stride,
                             const CNN_LAYER_CONFIG *layer_config,
                             float **output, int out_stride, int start_idx,
                             int step) {
  assert(!layer_config->deconvolve);
  const int cstep = layer_config->in_channels * layer_config->out_channels;
  const int filter_height_half = layer_config->filter_height >> 1;
  const int filter_width_half = layer_config->filter_width >> 1;
  const int channel_step = AOMMAX(step, 1);

  if (layer_config->maxpool &&
      (layer_config->skip_height > 1 || layer_config->skip_width > 1)) {
    switch (layer_config->pad) {
      case PADDING_SAME_ZERO:
        convolve_maxpool_padding_zero(input, in_width, in_height, in_stride,
                                      layer_config, output, out_stride, cstep,
                                      filter_width_half, filter_height_half);
        break;
      case PADDING_SAME_REPLICATE:
        convolve_maxpool_padding_replicate(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, cstep, filter_width_half, filter_height_half);
        break;
      case PADDING_VALID:
        convolve_maxpool_padding_valid(input, in_width, in_height, in_stride,
                                       layer_config, output, out_stride, cstep);
        break;
      default: assert(0 && "Unknown padding type");
    }
  } else {
    // Results in element-wise matrix multiplication.
    if (layer_config->filter_height == 1 && layer_config->filter_width == 1) {
      convolve_element_wise(input, in_width, in_height, in_stride, layer_config,
                            output, out_stride, start_idx, step);
      return;
    }
    const int ii_shift =
        filter_height_half - (layer_config->filter_height - 1) % 2;
    const int jj_shift =
        filter_width_half - (layer_config->filter_width - 1) % 2;
    switch (layer_config->pad) {
      case PADDING_SAME_ZERO:
        convolve_no_maxpool_padding_zero(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, filter_width_half, filter_height_half,
            ii_shift, jj_shift, channel_step);
        break;
      case PADDING_SAME_REPLICATE:
        convolve_no_maxpool_padding_replicate(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, ii_shift, jj_shift, channel_step);
        break;
      case PADDING_VALID:
        av1_cnn_convolve_no_maxpool_padding_valid(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, channel_step);
        break;
      default: assert(0 && "Unknown padding type");
    }
  }
}